

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::quath>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *result)

{
  pointer *ppqVar1;
  pointer pqVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  quath qVar5;
  half3 hVar6;
  quath qVar7;
  half4 hVar8;
  bool bVar9;
  ulong uVar10;
  char cVar11;
  char c;
  quath value;
  half4 v;
  char local_59;
  quath local_58;
  undefined1 local_50 [4];
  half ahStack_4c [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pqVar2 = (result->
           super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar2) {
    (result->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
    _M_impl.super__Vector_impl_data._M_finish = pqVar2;
  }
  bVar9 = SkipWhitespaceAndNewline(this,true);
  if (bVar9) {
    bVar9 = ReadBasicType(this,(half4 *)local_50);
    hVar8._M_elems = _local_50;
    if (bVar9) {
      local_58.real.value = local_50._0_2_;
      local_58.imag._M_elems[0].value = local_50._2_2_;
      local_58.imag._M_elems[1].value = ahStack_4c[0].value;
      local_58.imag._M_elems[2].value = ahStack_4c[1].value;
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      _local_50 = hVar8._M_elems;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>::
        _M_realloc_insert<tinyusdz::value::quath_const&>
                  ((vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>> *)result,
                   iVar3,&local_58);
      }
      else {
        hVar6._M_elems = hVar8._M_elems._2_6_;
        qVar5.real.value = local_50._0_2_;
        qVar5.imag._M_elems[0].value = hVar6._M_elems[0].value;
        qVar5.imag._M_elems[1].value = hVar6._M_elems[1].value;
        qVar5.imag._M_elems[2].value = hVar6._M_elems[2].value;
        *iVar3._M_current = qVar5;
        ppqVar1 = &(result->
                   super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppqVar1 = *ppqVar1 + 1;
      }
    }
    else {
      _local_50 = (_Type)&local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Not starting with the value of requested type.\n","");
      PushError(this,(string *)local_50);
      if (_local_50 != (_Type)&local_40) {
        operator_delete((void *)_local_50,local_40._M_allocated_capacity + 1);
      }
    }
    if (bVar9) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003d88ed;
        bVar9 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar9) {
          return false;
        }
        bVar9 = Char1(this,&local_59);
        cVar11 = '\x01';
        if (bVar9) {
          if (local_59 == sep) {
            bVar9 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar9) {
              bVar9 = LookChar1(this,local_50);
              cVar11 = (local_50[0] == end_symbol) * '\x03';
              if (!bVar9) {
                cVar11 = '\x01';
              }
              if (local_50[0] != end_symbol && bVar9) goto LAB_003d8841;
            }
          }
          else {
LAB_003d8841:
            if (local_59 == sep) {
              cVar11 = '\x01';
              bVar9 = SkipWhitespaceAndNewline(this,true);
              if (bVar9) {
                bVar9 = ReadBasicType(this,(half4 *)local_50);
                hVar8._M_elems = _local_50;
                if (bVar9) {
                  local_58.real.value = local_50._0_2_;
                  local_58.imag._M_elems[0].value = local_50._2_2_;
                  local_58.imag._M_elems[1].value = ahStack_4c[0].value;
                  local_58.imag._M_elems[2].value = ahStack_4c[1].value;
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  _local_50 = hVar8._M_elems;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>::
                    _M_realloc_insert<tinyusdz::value::quath_const&>
                              ((vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>
                                *)result,iVar3,&local_58);
                  }
                  else {
                    hVar6._M_elems = hVar8._M_elems._2_6_;
                    qVar7.real.value = local_50._0_2_;
                    qVar7.imag._M_elems[0].value = hVar6._M_elems[0].value;
                    qVar7.imag._M_elems[1].value = hVar6._M_elems[1].value;
                    qVar7.imag._M_elems[2].value = hVar6._M_elems[2].value;
                    *iVar3._M_current = qVar7;
                    ppqVar1 = &(result->
                               super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppqVar1 = *ppqVar1 + 1;
                  }
                  cVar11 = '\0';
                }
                else {
                  cVar11 = '\x03';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar11 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar10 = pSVar4->idx_ - 1, uVar10 <= pSVar4->length_)
                 ) {
                pSVar4->idx_ = uVar10;
              }
            }
          }
        }
      } while (cVar11 == '\0');
      if (cVar11 != '\x01') {
LAB_003d88ed:
        if ((result->
            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        _local_50 = (_Type)&local_40;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Empty array.\n","");
        PushError(this,(string *)local_50);
        if (_local_50 != (_Type)&local_40) {
          operator_delete((void *)_local_50,local_40._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}